

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::ArrayFeatureType::MergePartialFromCodedStream
          (ArrayFeatureType *this,CodedInputStream *input)

{
  DefaultOptionalValueUnion *value_00;
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  uint32 uVar6;
  undefined8 in_RAX;
  ArrayFeatureType_ShapeRange *value_01;
  ArrayFeatureType_EnumeratedShapes *value_02;
  char cVar7;
  ulong uVar8;
  undefined8 uStack_38;
  int value;
  
  value_00 = &this->defaultOptionalValue_;
  uStack_38 = in_RAX;
LAB_00194862:
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar8 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar5 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar5, (~(uint)*pbVar1 & uVar5) < 0x80))
        goto LAB_00194a4a;
        uVar8 = (ulong)((uVar5 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar8 = uVar8 | 0x100000000;
    }
    else {
LAB_00194a4a:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar8 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar6 | uVar8;
    }
    uVar6 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) {
LAB_001948bf:
      if (uVar6 == 0) {
        return true;
      }
      if ((uVar6 & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
    }
    else {
      uVar5 = (uint)(uVar8 >> 3) & 0x1fffffff;
      cVar7 = (char)uVar8;
      if (uVar5 == 0x3d) {
        if (cVar7 != -0x17) goto LAB_001948bf;
        this->_oneof_case_[1] = 0;
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (input,&value_00->doubledefaultvalue_);
        if (!bVar4) {
          return false;
        }
        this->_oneof_case_[1] = 0x3d;
        goto LAB_00194862;
      }
      if (uVar5 == 2) {
        if (cVar7 != '\x10') goto LAB_001948bf;
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (input,&value);
        if (!bVar4) {
          return false;
        }
        this->datatype_ = value;
        goto LAB_00194862;
      }
      if (uVar5 == 0x15) {
        if (cVar7 == -0x56) {
          value_02 = mutable_enumeratedshapes(this);
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::ArrayFeatureType_EnumeratedShapes>
                            (input,value_02);
          goto LAB_001948df;
        }
        goto LAB_001948bf;
      }
      if (uVar5 == 0x1f) {
        if (cVar7 == -6) {
          value_01 = mutable_shaperange(this);
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::ArrayFeatureType_ShapeRange>
                            (input,value_01);
          goto LAB_001948df;
        }
        goto LAB_001948bf;
      }
      if (uVar5 == 0x29) {
        if (cVar7 != 'H') goto LAB_001948bf;
        this->_oneof_case_[1] = 0;
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,&value_00->intdefaultvalue_);
        if (!bVar4) {
          return false;
        }
        this->_oneof_case_[1] = 0x29;
        goto LAB_00194862;
      }
      if (uVar5 == 0x33) {
        if (cVar7 != -99) goto LAB_001948bf;
        this->_oneof_case_[1] = 0;
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (input,&value_00->floatdefaultvalue_);
        if (!bVar4) {
          return false;
        }
        this->_oneof_case_[1] = 0x33;
        goto LAB_00194862;
      }
      if (uVar5 != 1) goto LAB_001948bf;
      if (cVar7 == '\b') {
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (1,10,input,&this->shape_);
      }
      else {
        if ((uVar6 & 0xff) != 10) goto LAB_001948bf;
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input,&this->shape_);
      }
    }
LAB_001948df:
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool ArrayFeatureType::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ArrayFeatureType)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int64 shape = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_shape())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 10u, input, this->mutable_shape())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_datatype(static_cast< ::CoreML::Specification::ArrayFeatureType_ArrayDataType >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_enumeratedshapes()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(250u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_shaperange()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 intDefaultValue = 41;
      case 41: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(328u)) {
          clear_defaultOptionalValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &defaultOptionalValue_.intdefaultvalue_)));
          set_has_intdefaultvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float floatDefaultValue = 51;
      case 51: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(413u)) {
          clear_defaultOptionalValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &defaultOptionalValue_.floatdefaultvalue_)));
          set_has_floatdefaultvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double doubleDefaultValue = 61;
      case 61: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(489u)) {
          clear_defaultOptionalValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &defaultOptionalValue_.doubledefaultvalue_)));
          set_has_doubledefaultvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ArrayFeatureType)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ArrayFeatureType)
  return false;
#undef DO_
}